

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeVLDInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  DecodeStatus DVar3;
  uint uVar4;
  int iVar5;
  uint16_t *Decoder_00;
  uint64_t extraout_RDX;
  uint64_t uVar6;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint uVar7;
  long lVar8;
  
  uVar7 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  if (uVar2 - 0x398 < 0xc) {
LAB_001d7394:
    lVar8 = 0;
    if (uVar7 != 0x1f) {
      MCOperand_CreateReg0(Inst,(uint)DPairDecoderTable[uVar7]);
      lVar8 = 3;
    }
    DVar3 = (*(code *)((long)&DAT_0032d5e0 + (long)(int)(&DAT_0032d5e0)[lVar8]))();
    return DVar3;
  }
  if (uVar2 - 0x3d9 < 9) {
    lVar8 = 0;
    if (uVar7 < 0x1e) {
      MCOperand_CreateReg0(Inst,(uint)DPairSpacedDecoderTable[uVar7]);
      lVar8 = 3;
    }
    DVar3 = (*(code *)((long)&DAT_0032d5d0 + (long)(int)(&DAT_0032d5d0)[lVar8]))();
    return DVar3;
  }
  if (uVar2 - 0x3e2 < 9) goto LAB_001d7394;
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar7]);
  uVar4 = MCInst_getOpcode(Inst);
  iVar5 = 1;
  uVar2 = uVar4 - 0x444;
  if (uVar2 < 0x22) {
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_001d744b;
LAB_001d7470:
      iVar5 = 2;
    }
LAB_001d7475:
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[iVar5 + uVar7 & 0x1f]);
  }
  else {
LAB_001d744b:
    uVar4 = uVar4 - 0x4b8;
    if (uVar4 < 0x22) {
      if ((0x999UL >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_001d7475;
      if ((0x294a00000U >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_001d7470;
    }
  }
  uVar4 = MCInst_getOpcode(Inst);
  Decoder_00 = (uint16_t *)0x2;
  uVar2 = uVar4 - 0x444;
  if (uVar2 < 0x22) {
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_001d74c8;
LAB_001d74ed:
      Decoder_00 = (uint16_t *)0x4;
    }
LAB_001d74f2:
    Decoder_00 = (uint16_t *)(ulong)((int)Decoder_00 + uVar7 & 0x1f);
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[(long)Decoder_00]);
  }
  else {
LAB_001d74c8:
    uVar4 = uVar4 - 0x4b8;
    if (uVar4 < 0x22) {
      if ((0x999UL >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_001d74f2;
      Decoder_00 = (uint16_t *)0x294a00000;
      if ((0x294a00000U >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_001d74ed;
    }
  }
  uVar4 = Insn >> 0x10 & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  uVar2 = uVar2 - 0x4b8;
  if (uVar2 < 0x22) {
    Decoder_00 = (uint16_t *)0x3;
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      Decoder_00 = (uint16_t *)0x294a00000;
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_001d7568;
      Decoder_00 = (uint16_t *)0x6;
    }
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar7 + (int)Decoder_00 & 0x1f]);
  }
LAB_001d7568:
  uVar2 = MCInst_getOpcode(Inst);
  uVar6 = extraout_RDX;
  if ((int)uVar2 < 0x3da) {
    if ((uVar2 - 0x370 < 0x34) &&
       (Decoder_00 = (uint16_t *)0xdb6f67860f67b,
       (0xdb6f67860f67bU >> ((ulong)(uVar2 - 0x370) & 0x3f) & 1) != 0)) {
LAB_001d75b9:
      MCOperand_CreateImm0(Inst,0);
      uVar6 = extraout_RDX_00;
    }
  }
  else {
    Decoder_00 = (uint16_t *)(ulong)(uVar2 - 0x3da);
    if ((uVar2 - 0x3da < 0x23) &&
       (uVar6 = 0x61861b6db, (0x61861b6dbU >> ((ulong)Decoder_00 & 0x3f) & 1) != 0))
    goto LAB_001d75b9;
    uVar7 = uVar2 - 0x447;
    Decoder_00 = (uint16_t *)(ulong)uVar7;
    if (((uVar7 < 0x1f) && (uVar6 = 0x42100111, (0x42100111U >> (uVar7 & 0x1f) & 1) != 0)) ||
       ((uVar2 - 0x4bb < 0x1f &&
        (Decoder_00 = (uint16_t *)0x42100111, (0x42100111U >> (uVar2 - 0x4bb & 0x1f) & 1) != 0)))) {
      Decoder_00 = GPRDecoderTable;
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
      uVar6 = extraout_RDX_01;
    }
  }
  DVar3 = DecodeAddrMode6Operand(Inst,Insn & 0x30 | uVar4,uVar6,Decoder_00);
  if (DVar3 == MCDisassembler_Fail) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 == MCDisassembler_SoftFail) goto LAB_001d75ec;
      bVar1 = false;
    }
    DVar3 = MCDisassembler_Success;
  }
LAB_001d75ec:
  if (!bVar1) {
    return MCDisassembler_Fail;
  }
  uVar2 = MCInst_getOpcode(Inst);
  if ((0x33 < uVar2 - 0x370) || ((0xdb6d26820d269U >> ((ulong)(uVar2 - 0x370) & 0x3f) & 1) == 0)) {
    if ((uVar2 - 0x3da < 0x22) && ((0x208209249U >> ((ulong)(uVar2 - 0x3da) & 0x3f) & 1) != 0)) {
      return DVar3;
    }
    uVar2 = 0;
    if ((Insn & 0xf) == 0xd) goto LAB_001d7630;
  }
  if ((~Insn & 0xd) == 0) {
    return DVar3;
  }
  uVar2 = (uint)GPRDecoderTable[Insn & 0xf];
LAB_001d7630:
  MCOperand_CreateReg0(Inst,uVar2);
  return DVar3;
}

Assistant:

static DecodeStatus DecodeVLDInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned wb, Rn, Rm;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	wb = fieldFromInstruction_4(Insn, 16, 4);
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 4, 2) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	// First output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1q16: case ARM_VLD1q32: case ARM_VLD1q64: case ARM_VLD1q8:
		case ARM_VLD1q16wb_fixed: case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_fixed: case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_fixed: case ARM_VLD1q64wb_register:
		case ARM_VLD1q8wb_fixed: case ARM_VLD1q8wb_register:
		case ARM_VLD2d16: case ARM_VLD2d32: case ARM_VLD2d8:
		case ARM_VLD2d16wb_fixed: case ARM_VLD2d16wb_register:
		case ARM_VLD2d32wb_fixed: case ARM_VLD2d32wb_register:
		case ARM_VLD2d8wb_fixed: case ARM_VLD2d8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2b16:
		case ARM_VLD2b32:
		case ARM_VLD2b8:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b16wb_register:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2b32wb_register:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b8wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	// Second output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD3d8:
		case ARM_VLD3d16:
		case ARM_VLD3d32:
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+1)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD3q8:
		case ARM_VLD3q16:
		case ARM_VLD3q32:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
		default:
			break;
	}

	// Third output register
	switch(MCInst_getOpcode(Inst)) {
		case ARM_VLD3d8:
		case ARM_VLD3d16:
		case ARM_VLD3d32:
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD3q8:
		case ARM_VLD3q16:
		case ARM_VLD3q32:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+4)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Fourth output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+6)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Writeback operand
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1d8wb_fixed:
		case ARM_VLD1d16wb_fixed:
		case ARM_VLD1d32wb_fixed:
		case ARM_VLD1d64wb_fixed:
		case ARM_VLD1d8wb_register:
		case ARM_VLD1d16wb_register:
		case ARM_VLD1d32wb_register:
		case ARM_VLD1d64wb_register:
		case ARM_VLD1q8wb_fixed:
		case ARM_VLD1q16wb_fixed:
		case ARM_VLD1q32wb_fixed:
		case ARM_VLD1q64wb_fixed:
		case ARM_VLD1q8wb_register:
		case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_register:
		case ARM_VLD1d8Twb_fixed:
		case ARM_VLD1d8Twb_register:
		case ARM_VLD1d16Twb_fixed:
		case ARM_VLD1d16Twb_register:
		case ARM_VLD1d32Twb_fixed:
		case ARM_VLD1d32Twb_register:
		case ARM_VLD1d64Twb_fixed:
		case ARM_VLD1d64Twb_register:
		case ARM_VLD1d8Qwb_fixed:
		case ARM_VLD1d8Qwb_register:
		case ARM_VLD1d16Qwb_fixed:
		case ARM_VLD1d16Qwb_register:
		case ARM_VLD1d32Qwb_fixed:
		case ARM_VLD1d32Qwb_register:
		case ARM_VLD1d64Qwb_fixed:
		case ARM_VLD1d64Qwb_register:
		case ARM_VLD2d8wb_fixed:
		case ARM_VLD2d16wb_fixed:
		case ARM_VLD2d32wb_fixed:
		case ARM_VLD2q8wb_fixed:
		case ARM_VLD2q16wb_fixed:
		case ARM_VLD2q32wb_fixed:
		case ARM_VLD2d8wb_register:
		case ARM_VLD2d16wb_register:
		case ARM_VLD2d32wb_register:
		case ARM_VLD2q8wb_register:
		case ARM_VLD2q16wb_register:
		case ARM_VLD2q32wb_register:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2b8wb_register:
		case ARM_VLD2b16wb_register:
		case ARM_VLD2b32wb_register:
			MCOperand_CreateImm0(Inst, 0);
			break;
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, wb, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// AddrMode6 Base (register+alignment)
	if (!Check(&S, DecodeAddrMode6Operand(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	// AddrMode6 Offset (register)
	switch (MCInst_getOpcode(Inst)) {
		default:
			// The below have been updated to have explicit am6offset split
			// between fixed and register offset. For those instructions not
			// yet updated, we need to add an additional reg0 operand for the
			// fixed variant.
			//
			// The fixed offset encodes as Rm == 0xd, so we check for that.
			if (Rm == 0xd) {
				MCOperand_CreateReg0(Inst, 0);
				break;
			}
			// Fall through to handle the register offset variant.
		case ARM_VLD1d8wb_fixed:
		case ARM_VLD1d16wb_fixed:
		case ARM_VLD1d32wb_fixed:
		case ARM_VLD1d64wb_fixed:
		case ARM_VLD1d8Twb_fixed:
		case ARM_VLD1d16Twb_fixed:
		case ARM_VLD1d32Twb_fixed:
		case ARM_VLD1d64Twb_fixed:
		case ARM_VLD1d8Qwb_fixed:
		case ARM_VLD1d16Qwb_fixed:
		case ARM_VLD1d32Qwb_fixed:
		case ARM_VLD1d64Qwb_fixed:
		case ARM_VLD1d8wb_register:
		case ARM_VLD1d16wb_register:
		case ARM_VLD1d32wb_register:
		case ARM_VLD1d64wb_register:
		case ARM_VLD1q8wb_fixed:
		case ARM_VLD1q16wb_fixed:
		case ARM_VLD1q32wb_fixed:
		case ARM_VLD1q64wb_fixed:
		case ARM_VLD1q8wb_register:
		case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_register:
			// The fixed offset post-increment encodes Rm == 0xd. The no-writeback
			// variant encodes Rm == 0xf. Anything else is a register offset post-
			// increment and we need to add the register operand to the instruction.
			if (Rm != 0xD && Rm != 0xF &&
					!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2d8wb_fixed:
		case ARM_VLD2d16wb_fixed:
		case ARM_VLD2d32wb_fixed:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2q8wb_fixed:
		case ARM_VLD2q16wb_fixed:
		case ARM_VLD2q32wb_fixed:
			break;
	}

	return S;
}